

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall rpc_tests::rpc_rawsign::test_method(rpc_rawsign *this)

{
  string_view key;
  string_view key_00;
  string *this_00;
  long in_FS_OFFSET;
  string privkey2;
  string privkey1;
  string notsigned;
  string prevout;
  UniValue r;
  UniValue *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa27;
  UniValue *in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  UniValue *in_stack_fffffffffffffa48;
  UniValue *in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa58;
  unit_test_log_t *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa6f;
  string *in_stack_fffffffffffffab8;
  string *args;
  RPCTestingSetup *in_stack_fffffffffffffac0;
  const_string local_508 [2];
  lazy_ostream local_4e8;
  allocator<char> local_479;
  const_string local_478 [2];
  assertion_result local_428 [2];
  allocator<char> local_3ed;
  allocator<char> local_3ec;
  allocator<char> local_3eb;
  allocator<char> local_3ea;
  allocator<char> local_3e9 [905];
  string local_60 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::UniValue(in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
             (char *)in_stack_fffffffffffffa60,(allocator<char> *)in_stack_fffffffffffffa58);
  std::allocator<char>::~allocator(local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
             (char *)in_stack_fffffffffffffa60,(allocator<char> *)in_stack_fffffffffffffa58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (char *)in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (char *)in_stack_fffffffffffffa28);
  RPCTestingSetup::CallRPC(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  args = local_60;
  UniValue::operator=(in_stack_fffffffffffffa28,
                      (UniValue *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator(&local_3ea);
  this_00 = UniValue::get_str_abi_cxx11_
                      ((UniValue *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
  std::__cxx11::string::string(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
             (char *)in_stack_fffffffffffffa60,(allocator<char> *)in_stack_fffffffffffffa58);
  std::allocator<char>::~allocator(&local_3eb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
             (char *)in_stack_fffffffffffffa60,(allocator<char> *)in_stack_fffffffffffffa58);
  std::allocator<char>::~allocator(&local_3ec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
             (char *)in_stack_fffffffffffffa60,(allocator<char> *)in_stack_fffffffffffffa58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (char *)in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa28);
  RPCTestingSetup::CallRPC((RPCTestingSetup *)this_00,args);
  UniValue::operator=(in_stack_fffffffffffffa28,
                      (UniValue *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator(&local_3ed);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
               (pointer)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa58,
               (const_string *)in_stack_fffffffffffffa50,(size_t)in_stack_fffffffffffffa48,
               (const_string *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    UniValue::get_obj((UniValue *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa38,
               (char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    key._M_str._0_7_ = in_stack_fffffffffffffa68;
    key._M_len = (size_t)in_stack_fffffffffffffa60;
    key._M_str._7_1_ = in_stack_fffffffffffffa6f;
    UniValue::find_value
              ((UniValue *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),key);
    UniValue::get_bool((UniValue *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28,(bool)in_stack_fffffffffffffa27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
               (pointer)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
               (pointer)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               (unsigned_long)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa18 = (UniValue *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_428,(lazy_ostream *)&stack0xfffffffffffffba8,local_478,0xcf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffa18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa6f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffa6f);
  __s = &local_479;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),(char *)__s,
             (allocator<char> *)in_stack_fffffffffffffa58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (char *)in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (char *)in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (char *)in_stack_fffffffffffffa28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa28);
  RPCTestingSetup::CallRPC((RPCTestingSetup *)this_00,args);
  UniValue::operator=(in_stack_fffffffffffffa28,
                      (UniValue *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator(&local_479);
  do {
    this_01 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
               (pointer)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,(const_string *)in_stack_fffffffffffffa50,(size_t)in_stack_fffffffffffffa48,
               (const_string *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    in_stack_fffffffffffffa50 =
         UniValue::get_obj((UniValue *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20)
                          );
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa38,
               (char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    key_00._M_str._0_7_ = in_stack_fffffffffffffa68;
    key_00._M_len = (size_t)__s;
    key_00._M_str._7_1_ = in_stack_fffffffffffffa6f;
    in_stack_fffffffffffffa48 =
         UniValue::find_value
                   ((UniValue *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),key_00
                   );
    in_stack_fffffffffffffa47 =
         UniValue::get_bool((UniValue *)
                            CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28,(bool)in_stack_fffffffffffffa27);
    in_stack_fffffffffffffa38 =
         (basic_string_view<char,_std::char_traits<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
               (pointer)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
               (pointer)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               (unsigned_long)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa18 = (UniValue *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffb48,&local_4e8,local_508,0xd1,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffa18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa37 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffa37);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_rawsign)
{
    UniValue r;
    // input is a 1-of-2 multisig (so is output):
    std::string prevout =
      "[{\"txid\":\"b4cc287e58f87cdae59417329f710f3ecd75a4ee1d2872b7248f50977c8493f3\","
      "\"vout\":1,\"scriptPubKey\":\"a914b10c9df5f7edf436c697f02f1efdba4cf399615187\","
      "\"redeemScript\":\"512103debedc17b3df2badbcdd86d5feb4562b86fe182e5998abd8bcd4f122c6155b1b21027e940bb73ab8732bfdf7f9216ecefca5b94d6df834e77e108f68e66f126044c052ae\"}]";
    r = CallRPC(std::string("createrawtransaction ")+prevout+" "+
      "{\"3HqAe9LtNBjnsfM4CyYaWTnvCaUYT7v4oZ\":11}");
    std::string notsigned = r.get_str();
    std::string privkey1 = "\"KzsXybp9jX64P5ekX1KUxRQ79Jht9uzW7LorgwE65i5rWACL6LQe\"";
    std::string privkey2 = "\"Kyhdf5LuKTRx4ge69ybABsiUAWjVRK4XGxAKk2FQLp2HjGMy87Z4\"";
    r = CallRPC(std::string("signrawtransactionwithkey ")+notsigned+" [] "+prevout);
    BOOST_CHECK(r.get_obj().find_value("complete").get_bool() == false);
    r = CallRPC(std::string("signrawtransactionwithkey ")+notsigned+" ["+privkey1+","+privkey2+"] "+prevout);
    BOOST_CHECK(r.get_obj().find_value("complete").get_bool() == true);
}